

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O2

int ARGBBlend(uint8_t *src_argb0,int src_stride_argb0,uint8_t *src_argb1,int src_stride_argb1,
             uint8_t *dst_argb,int dst_stride_argb,int width,int height)

{
  int iVar1;
  int iVar2;
  ARGBBlendRow p_Var3;
  bool bVar4;
  
  p_Var3 = GetARGBBlend();
  if (height == 0 ||
      (width < 1 ||
      (dst_argb == (uint8_t *)0x0 || (src_argb1 == (uint8_t *)0x0 || src_argb0 == (uint8_t *)0x0))))
  {
    iVar1 = -1;
  }
  else {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      dst_argb = dst_argb + ~height * dst_stride_argb;
      dst_stride_argb = -dst_stride_argb;
    }
    iVar2 = width * 4;
    if ((iVar2 == src_stride_argb1 && iVar2 == src_stride_argb0) && dst_stride_argb == iVar2) {
      width = iVar1 * width;
      iVar1 = 1;
      src_stride_argb0 = 0;
      src_stride_argb1 = 0;
      dst_stride_argb = 0;
    }
    while (bVar4 = iVar1 != 0, iVar1 = iVar1 + -1, bVar4) {
      (*p_Var3)(src_argb0,src_argb1,dst_argb,width);
      src_argb0 = src_argb0 + src_stride_argb0;
      src_argb1 = src_argb1 + src_stride_argb1;
      dst_argb = dst_argb + dst_stride_argb;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int ARGBBlend(const uint8_t* src_argb0,
              int src_stride_argb0,
              const uint8_t* src_argb1,
              int src_stride_argb1,
              uint8_t* dst_argb,
              int dst_stride_argb,
              int width,
              int height) {
  int y;
  void (*ARGBBlendRow)(const uint8_t* src_argb, const uint8_t* src_argb1,
                       uint8_t* dst_argb, int width) = GetARGBBlend();
  if (!src_argb0 || !src_argb1 || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_argb = dst_argb + (height - 1) * dst_stride_argb;
    dst_stride_argb = -dst_stride_argb;
  }
  // Coalesce rows.
  if (src_stride_argb0 == width * 4 && src_stride_argb1 == width * 4 &&
      dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_argb0 = src_stride_argb1 = dst_stride_argb = 0;
  }

  for (y = 0; y < height; ++y) {
    ARGBBlendRow(src_argb0, src_argb1, dst_argb, width);
    src_argb0 += src_stride_argb0;
    src_argb1 += src_stride_argb1;
    dst_argb += dst_stride_argb;
  }
  return 0;
}